

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O3

void __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::Initialize(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
             *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  HeapAllocator *this_00;
  undefined4 *puVar5;
  EntryType **__s;
  DictionaryStats *pDVar6;
  size_t byteSize;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  this->disableResize = false;
  this->free = (EntryType *)0x0;
  data.plusSize = (size_t)this->size;
  local_50 = (undefined1  [8])&SimpleHashEntry<Js::JavascriptPromise*,int>*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_2792d81;
  data.filename._0_4_ = 0x41;
  this_00 = Memory::HeapAllocator::TrackAllocInfo(this->allocator,(TrackAllocData *)local_50);
  uVar1 = this->size;
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00cf4912;
    *puVar5 = 0;
  }
  byteSize = (ulong)uVar1 << 3;
  __s = (EntryType **)Memory::HeapAllocator::AllocT<false>(this_00,byteSize);
  memset(__s,0,byteSize);
  if (__s == (EntryType **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00cf4912:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this->table = __s;
  pDVar6 = DictionaryStats::Create
                     ("P15SimpleHashTableIPN2Js17JavascriptPromiseEiN6Memory13HeapAllocatorE15DefaultComparerLb0E14PowerOf2PolicyE"
                      ,this->size);
  this->stats = pDVar6;
  return;
}

Assistant:

void Initialize()
    {
        disableResize = false;
        free = nullptr;
        table = AllocatorNewArrayZ(TAllocator, allocator, EntryType*, size);
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
    }